

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int ParseFrame(VP8Decoder *dec,VP8Io *io)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  VP8Decoder *in_RDI;
  VP8BitReader *token_br;
  VP8Decoder *in_stack_ffffffffffffffd8;
  VP8Decoder *dec_00;
  
  in_RDI->mb_y = 0;
  while( true ) {
    if (in_RDI->br_mb_y <= in_RDI->mb_y) {
      if (0 < in_RDI->mt_method) {
        pWVar2 = WebPGetWorkerInterface();
        iVar1 = (*pWVar2->Sync)(&in_RDI->worker);
        if (iVar1 == 0) {
          return 0;
        }
      }
      return 1;
    }
    dec_00 = (VP8Decoder *)(in_RDI->parts + (in_RDI->mb_y & in_RDI->num_parts_minus_one));
    iVar1 = VP8ParseIntraModeRow((VP8BitReader *)dec_00,in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      iVar1 = VP8SetError(in_RDI,VP8_STATUS_NOT_ENOUGH_DATA,
                          "Premature end-of-partition0 encountered.");
      return iVar1;
    }
    while (in_RDI->mb_x < in_RDI->mb_w) {
      iVar1 = VP8DecodeMB((VP8Decoder *)io,token_br);
      if (iVar1 == 0) {
        iVar1 = VP8SetError(in_RDI,VP8_STATUS_NOT_ENOUGH_DATA,"Premature end-of-file encountered.");
        return iVar1;
      }
      in_RDI->mb_x = in_RDI->mb_x + 1;
    }
    VP8InitScanline(dec_00);
    iVar1 = VP8ProcessRow((VP8Decoder *)io,(VP8Io *)token_br);
    if (iVar1 == 0) break;
    in_RDI->mb_y = in_RDI->mb_y + 1;
  }
  iVar1 = VP8SetError(in_RDI,VP8_STATUS_USER_ABORT,"Output aborted.");
  return iVar1;
}

Assistant:

static int ParseFrame(VP8Decoder* const dec, VP8Io* io) {
  for (dec->mb_y = 0; dec->mb_y < dec->br_mb_y; ++dec->mb_y) {
    // Parse bitstream for this row.
    VP8BitReader* const token_br =
        &dec->parts[dec->mb_y & dec->num_parts_minus_one];
    if (!VP8ParseIntraModeRow(&dec->br, dec)) {
      return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                         "Premature end-of-partition0 encountered.");
    }
    for (; dec->mb_x < dec->mb_w; ++dec->mb_x) {
      if (!VP8DecodeMB(dec, token_br)) {
        return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                           "Premature end-of-file encountered.");
      }
    }
    VP8InitScanline(dec);   // Prepare for next scanline

    // Reconstruct, filter and emit the row.
    if (!VP8ProcessRow(dec, io)) {
      return VP8SetError(dec, VP8_STATUS_USER_ABORT, "Output aborted.");
    }
  }
  if (dec->mt_method > 0) {
    if (!WebPGetWorkerInterface()->Sync(&dec->worker)) return 0;
  }

  return 1;
}